

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O0

dict_t * dict_init(ps_config_t *config,bin_mdef_t *mdef)

{
  int iVar1;
  s3wid_t sVar2;
  dictword_t *pdVar3;
  bin_mdef_t *pbVar4;
  hash_table_t *phVar5;
  int local_64;
  char *local_60;
  char *fillerfile;
  char *dictfile;
  dict_t *pdStack_48;
  s3cipid_t sil;
  dict_t *d;
  lineiter_t *li;
  FILE *pFStack_30;
  int32 n;
  FILE *fp2;
  FILE *fp;
  bin_mdef_t *mdef_local;
  ps_config_t *config_local;
  
  fillerfile = (char *)0x0;
  local_60 = (char *)0x0;
  fp = (FILE *)mdef;
  mdef_local = (bin_mdef_t *)config;
  if (config != (ps_config_t *)0x0) {
    fillerfile = ps_config_str(config,"dict");
    local_60 = ps_config_str((cmd_ln_t *)mdef_local,"fdict");
  }
  fp2 = (FILE *)0x0;
  li._4_4_ = 0;
  if (fillerfile != (char *)0x0) {
    fp2 = (FILE *)fopen(fillerfile,"r");
    if ((FILE *)fp2 == (FILE *)0x0) {
      err_msg_system(ERR_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                     ,0x111,"Failed to open dictionary file \'%s\' for reading",fillerfile);
      return (dict_t *)0x0;
    }
    for (d = (dict_t *)lineiter_start(fp2); d != (dict_t *)0x0;
        d = (dict_t *)lineiter_next((lineiter_t *)d)) {
      iVar1 = strncmp(*(char **)d,"##",2);
      if ((iVar1 != 0) && (iVar1 = strncmp(*(char **)d,";;",2), iVar1 != 0)) {
        li._4_4_ = li._4_4_ + 1;
      }
    }
    fseek((FILE *)fp2,0,0);
  }
  pFStack_30 = (FILE *)0x0;
  if (local_60 != (char *)0x0) {
    pFStack_30 = fopen(local_60,"r");
    if (pFStack_30 == (FILE *)0x0) {
      err_msg_system(ERR_ERROR,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                     ,0x11f,"Failed to open filler dictionary file \'%s\' for reading",local_60);
      fclose((FILE *)fp2);
      return (dict_t *)0x0;
    }
    for (d = (dict_t *)lineiter_start((FILE *)pFStack_30); d != (dict_t *)0x0;
        d = (dict_t *)lineiter_next((lineiter_t *)d)) {
      iVar1 = strncmp(*(char **)d,"##",2);
      if ((iVar1 != 0) && (iVar1 = strncmp(*(char **)d,";;",2), iVar1 != 0)) {
        li._4_4_ = li._4_4_ + 1;
      }
    }
    fseek(pFStack_30,0,0);
  }
  pdStack_48 = (dict_t *)
               __ckd_calloc__(1,0x40,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                              ,0x12f);
  pdStack_48->refcnt = 1;
  if ((int)(li._4_4_ + 0x1000) < 0x7ffffffe) {
    local_64 = li._4_4_ + 0x1000;
  }
  else {
    local_64 = 0x7ffffffe;
  }
  pdStack_48->max_words = local_64;
  if ((int)li._4_4_ < 0x7ffffffe) {
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c",
            0x13e,"Allocating %d * %d bytes (%d KiB) for word entries\n",
            (ulong)(uint)pdStack_48->max_words,0x20,(ulong)((long)pdStack_48->max_words << 5) >> 10)
    ;
    pdVar3 = (dictword_t *)
             __ckd_calloc__((long)pdStack_48->max_words,0x20,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                            ,0x13f);
    pdStack_48->word = pdVar3;
    pdStack_48->n_word = 0;
    if (fp != (FILE *)0x0) {
      pbVar4 = bin_mdef_retain((bin_mdef_t *)fp);
      pdStack_48->mdef = pbVar4;
    }
    if (mdef_local != (bin_mdef_t *)0x0) {
      iVar1 = ps_config_bool((ps_config_t *)mdef_local,"dictcase");
      pdStack_48->nocase = iVar1;
    }
    phVar5 = hash_table_new(pdStack_48->max_words,pdStack_48->nocase);
    pdStack_48->ht = phVar5;
    if (fp2 != (FILE *)0x0) {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
              ,0x14b,"Reading main dictionary: %s\n",fillerfile);
      dict_read(fp2,pdStack_48);
      fclose((FILE *)fp2);
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
              ,0x14e,"%d words read\n",(ulong)(uint)pdStack_48->n_word);
    }
    sVar2 = dict_wordid(pdStack_48,"<s>");
    if (sVar2 == -1) {
      sVar2 = dict_wordid(pdStack_48,"</s>");
      if (sVar2 == -1) {
        sVar2 = dict_wordid(pdStack_48,"<sil>");
        if (sVar2 == -1) {
          pdStack_48->filler_start = pdStack_48->n_word;
          if (pFStack_30 != (FILE *)0x0) {
            err_msg(ERR_INFO,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                    ,0x164,"Reading filler dictionary: %s\n",local_60);
            dict_read((FILE *)pFStack_30,pdStack_48);
            fclose(pFStack_30);
            err_msg(ERR_INFO,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                    ,0x167,"%d words read\n",
                    (ulong)(uint)(pdStack_48->n_word - pdStack_48->filler_start));
          }
          if (fp == (FILE *)0x0) {
            dictfile._6_2_ = 0;
          }
          else {
            dictfile._6_2_ = (undefined2)*(undefined4 *)&fp->_IO_write_ptr;
          }
          sVar2 = dict_wordid(pdStack_48,"<s>");
          if (sVar2 == -1) {
            dict_add_word(pdStack_48,"<s>",(s3cipid_t *)((long)&dictfile + 6),1);
          }
          sVar2 = dict_wordid(pdStack_48,"</s>");
          if (sVar2 == -1) {
            dict_add_word(pdStack_48,"</s>",(s3cipid_t *)((long)&dictfile + 6),1);
          }
          sVar2 = dict_wordid(pdStack_48,"<sil>");
          if (sVar2 == -1) {
            dict_add_word(pdStack_48,"<sil>",(s3cipid_t *)((long)&dictfile + 6),1);
          }
          pdStack_48->filler_end = pdStack_48->n_word + -1;
          sVar2 = dict_wordid(pdStack_48,"<s>");
          pdStack_48->startwid = sVar2;
          sVar2 = dict_wordid(pdStack_48,"</s>");
          pdStack_48->finishwid = sVar2;
          sVar2 = dict_wordid(pdStack_48,"<sil>");
          pdStack_48->silwid = sVar2;
          if ((pdStack_48->filler_start <= pdStack_48->filler_end) &&
             (iVar1 = dict_filler_word(pdStack_48,pdStack_48->silwid), iVar1 != 0)) {
            return pdStack_48;
          }
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                  ,0x181,"Word \'%s\' must occur (only) in filler dictionary\n","<sil>");
          dict_free(pdStack_48);
        }
        else {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                  ,0x15c,"Remove silence word \'<sil>\' from the dictionary\n");
          dict_free(pdStack_48);
        }
      }
      else {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
                ,0x157,"Remove sentence start word \'</s>\' from the dictionary\n");
        dict_free(pdStack_48);
      }
    }
    else {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c"
              ,0x152,"Remove sentence start word \'<s>\' from the dictionary\n");
      dict_free(pdStack_48);
    }
  }
  else {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/dict.c",
            0x135,"Number of words in dictionaries (%d) exceeds limit (%d)\n",(ulong)li._4_4_,
            0x7ffffffe);
    if (fp2 != (FILE *)0x0) {
      fclose((FILE *)fp2);
    }
    if (pFStack_30 != (FILE *)0x0) {
      fclose(pFStack_30);
    }
    ckd_free(pdStack_48);
  }
  return (dict_t *)0x0;
}

Assistant:

dict_t *
dict_init(ps_config_t *config, bin_mdef_t * mdef)
{
    FILE *fp, *fp2;
    int32 n;
    lineiter_t *li;
    dict_t *d;
    s3cipid_t sil;
    char const *dictfile = NULL, *fillerfile = NULL;

    if (config) {
        dictfile = ps_config_str(config, "dict");
        fillerfile = ps_config_str(config, "fdict");
    }

    /*
     * First obtain #words in dictionary (for hash table allocation).
     * Reason: The PC NT system doesn't like to grow memory gradually.  Better to allocate
     * all the required memory in one go.
     */
    fp = NULL;
    n = 0;
    if (dictfile) {
        if ((fp = fopen(dictfile, "r")) == NULL) {
            E_ERROR_SYSTEM("Failed to open dictionary file '%s' for reading", dictfile);
            return NULL;
        }
        for (li = lineiter_start(fp); li; li = lineiter_next(li)) {
            if (0 != strncmp(li->buf, "##", 2)
                && 0 != strncmp(li->buf, ";;", 2))
                n++;
        }
	fseek(fp, 0L, SEEK_SET);
    }

    fp2 = NULL;
    if (fillerfile) {
        if ((fp2 = fopen(fillerfile, "r")) == NULL) {
            E_ERROR_SYSTEM("Failed to open filler dictionary file '%s' for reading", fillerfile);
            fclose(fp);
            return NULL;
	}
        for (li = lineiter_start(fp2); li; li = lineiter_next(li)) {
	    if (0 != strncmp(li->buf, "##", 2)
    	        && 0 != strncmp(li->buf, ";;", 2))
                n++;
        }
        fseek(fp2, 0L, SEEK_SET);
    }

    /*
     * Allocate dict entries.  HACK!!  Allow some extra entries for words not in file.
     * Also check for type size restrictions.
     */
    d = (dict_t *) ckd_calloc(1, sizeof(dict_t));       /* freed in dict_free() */
    d->refcnt = 1;
    d->max_words =
        (n + S3DICT_INC_SZ < MAX_S3WID) ? n + S3DICT_INC_SZ : MAX_S3WID;
    if (n >= MAX_S3WID) {
        E_ERROR("Number of words in dictionaries (%d) exceeds limit (%d)\n", n,
                MAX_S3WID);
        if (fp) fclose(fp);
        if (fp2) fclose(fp2);
        ckd_free(d);
        return NULL;
    }

    E_INFO("Allocating %d * %d bytes (%d KiB) for word entries\n",
           d->max_words, sizeof(dictword_t),
           d->max_words * sizeof(dictword_t) / 1024);
    d->word = (dictword_t *) ckd_calloc(d->max_words, sizeof(dictword_t));      /* freed in dict_free() */
    d->n_word = 0;
    if (mdef)
        d->mdef = bin_mdef_retain(mdef);

    /* Create new hash table for word strings; case-insensitive word strings */
    if (config)
        d->nocase = ps_config_bool(config, "dictcase");
    d->ht = hash_table_new(d->max_words, d->nocase);

    /* Digest main dictionary file */
    if (fp) {
        E_INFO("Reading main dictionary: %s\n", dictfile);
        dict_read(fp, d);
        fclose(fp);
        E_INFO("%d words read\n", d->n_word);
    }

    if (dict_wordid(d, S3_START_WORD) != BAD_S3WID) {
	E_ERROR("Remove sentence start word '<s>' from the dictionary\n");
	dict_free(d);
	return NULL;
    }
    if (dict_wordid(d, S3_FINISH_WORD) != BAD_S3WID) {
	E_ERROR("Remove sentence start word '</s>' from the dictionary\n");
	dict_free(d);
	return NULL;
    }
    if (dict_wordid(d, S3_SILENCE_WORD) != BAD_S3WID) {
	E_ERROR("Remove silence word '<sil>' from the dictionary\n");
	dict_free(d);
	return NULL;
    }

    /* Now the filler dictionary file, if it exists */
    d->filler_start = d->n_word;
    if (fp2) {
        E_INFO("Reading filler dictionary: %s\n", fillerfile);
        dict_read(fp2, d);
        fclose(fp2);
        E_INFO("%d words read\n", d->n_word - d->filler_start);
    }
    if (mdef)
        sil = bin_mdef_silphone(mdef);
    else
        sil = 0;
    if (dict_wordid(d, S3_START_WORD) == BAD_S3WID) {
        dict_add_word(d, S3_START_WORD, &sil, 1);
    }
    if (dict_wordid(d, S3_FINISH_WORD) == BAD_S3WID) {
        dict_add_word(d, S3_FINISH_WORD, &sil, 1);
    }
    if (dict_wordid(d, S3_SILENCE_WORD) == BAD_S3WID) {
        dict_add_word(d, S3_SILENCE_WORD, &sil, 1);
    }

    d->filler_end = d->n_word - 1;

    /* Initialize distinguished word-ids */
    d->startwid = dict_wordid(d, S3_START_WORD);
    d->finishwid = dict_wordid(d, S3_FINISH_WORD);
    d->silwid = dict_wordid(d, S3_SILENCE_WORD);

    if ((d->filler_start > d->filler_end)
        || (!dict_filler_word(d, d->silwid))) {
        E_ERROR("Word '%s' must occur (only) in filler dictionary\n",
                S3_SILENCE_WORD);
        dict_free(d);
        return NULL;
    }

    /* No check that alternative pronunciations for filler words are in filler range!! */

    return d;
}